

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_repository.cpp
# Opt level: O2

dispatcher_ref_t __thiscall
so_5::impl::disp_repository_t::query_named_dispatcher(disp_repository_t *this,string *disp_name)

{
  rw_spinlock_t<so_5::yield_backoff_t> *this_00;
  iterator iVar1;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  dispatcher_ref_t dVar3;
  
  this_00 = (rw_spinlock_t<so_5::yield_backoff_t> *)((long)&disp_name[3].field_2 + 8);
  rw_spinlock_t<so_5::yield_backoff_t>::lock_shared(this_00);
  _Var2._M_pi = extraout_RDX;
  if (*(int *)&disp_name[3].field_2 == 1) {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
                    *)&disp_name->field_2,in_RDX);
    _Var2._M_pi = extraout_RDX_00;
    if ((_Base_ptr)((long)&disp_name->field_2 + 8) != iVar1._M_node) {
      std::__shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2> *)(iVar1._M_node + 2)
                );
      _Var2._M_pi = extraout_RDX_01;
      goto LAB_00258561;
    }
  }
  this->_vptr_disp_repository_t = (_func_int **)0x0;
  this->m_env = (environment_t *)0x0;
LAB_00258561:
  LOCK();
  (this_00->m_counters).super___atomic_base<unsigned_long>._M_i =
       (this_00->m_counters).super___atomic_base<unsigned_long>._M_i - 2;
  UNLOCK();
  dVar3.super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  dVar3.super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (dispatcher_ref_t)dVar3.super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

dispatcher_ref_t
disp_repository_t::query_named_dispatcher(
	const std::string & disp_name )
{
	read_lock_guard_t< default_rw_spinlock_t > lock( m_lock );
	if( state_t::started == m_state )
	{
		named_dispatcher_map_t::iterator it =
			m_named_dispatcher_map.find( disp_name );

		if( m_named_dispatcher_map.end() != it )
		{
			return it->second;
		}
	}

	return dispatcher_ref_t();
}